

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selfguided_avx2.c
# Opt level: O0

int av1_selfguided_restoration_avx2
              (uint8_t *dgd8,int width,int height,int dgd_stride,int32_t *flt0,int32_t *flt1,
              int flt_stride,int sgr_params_idx,int bit_depth,int highbd)

{
  void *pvVar1;
  int in_EDX;
  int in_ESI;
  int in_stack_00000010;
  int in_stack_00000018;
  sgr_params_type *params;
  uint8_t *dgd0;
  int dgd_diag_border;
  int32_t *D;
  int32_t *C;
  int32_t *B;
  int32_t *A;
  int32_t *D0;
  int32_t *C0;
  int32_t *B0;
  int32_t *A0;
  int32_t *in_stack_00000078;
  int buf_diag_border;
  int32_t *Dtl;
  int32_t *Ctl;
  int32_t *Btl;
  int32_t *Atl;
  int buf_stride;
  int height_ext;
  int width_ext;
  int32_t *buf;
  int buf_elts;
  undefined4 in_stack_000000d0;
  int in_stack_000000e8;
  int in_stack_000000ec;
  uint16_t *in_stack_000000f0;
  void *in_stack_00000170;
  int in_stack_0000017c;
  int32_t *in_stack_00000180;
  int32_t *in_stack_00000188;
  int in_stack_00000194;
  int32_t *in_stack_00000198;
  int in_stack_00000260;
  int in_stack_00000264;
  int32_t *in_stack_00000268;
  int32_t *in_stack_00000270;
  int32_t *in_stack_00000278;
  int32_t *in_stack_00000280;
  int in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  size_t in_stack_ffffffffffffff28;
  sgr_params_type *psVar2;
  int local_c;
  
  pvVar1 = aom_memalign(in_stack_ffffffffffffff28,
                        CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  if (pvVar1 == (void *)0x0) {
    local_c = -1;
  }
  else {
    if ((int)params == 0) {
      integral_images((uint8_t *)in_stack_000000f0,in_stack_000000ec,in_stack_000000e8,dgd8._4_4_,
                      (int32_t *)CONCAT44(width,height),
                      (int32_t *)CONCAT44(dgd_stride,in_stack_000000d0),in_stack_ffffffffffffff10);
    }
    else {
      integral_images_highbd
                (in_stack_000000f0,in_stack_000000ec,in_stack_000000e8,dgd8._4_4_,
                 (int32_t *)CONCAT44(width,height),(int32_t *)CONCAT44(dgd_stride,in_stack_000000d0)
                 ,in_stack_ffffffffffffff10);
    }
    psVar2 = av1_sgr_params + in_stack_00000010;
    if (0 < psVar2->r[0]) {
      calc_ab_fast(in_stack_00000280,in_stack_00000278,in_stack_00000270,in_stack_00000268,
                   in_stack_00000264,in_stack_00000260,in_stack_00000018,in_stack_00000010,0,
                   (int)psVar2);
      in_stack_ffffffffffffff10 = in_ESI;
      final_filter_fast(in_stack_00000198,in_stack_00000194,in_stack_00000188,in_stack_00000180,
                        in_stack_0000017c,in_stack_00000170,in_ESI,in_EDX,(int)params,(int)psVar2);
    }
    if (0 < psVar2->r[1]) {
      calc_ab(in_stack_00000280,in_stack_00000278,in_stack_00000270,in_stack_00000268,
              in_stack_00000264,in_stack_00000260,in_stack_00000018,in_stack_00000010,1,(int)psVar2)
      ;
      final_filter(in_stack_00000078,A0._4_4_,B0,C0,D0._4_4_,A,in_ESI,in_EDX,(int)params,(int)psVar2
                  );
      in_stack_ffffffffffffff10 = in_ESI;
    }
    aom_free((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    local_c = 0;
  }
  return local_c;
}

Assistant:

int av1_selfguided_restoration_avx2(const uint8_t *dgd8, int width, int height,
                                    int dgd_stride, int32_t *flt0,
                                    int32_t *flt1, int flt_stride,
                                    int sgr_params_idx, int bit_depth,
                                    int highbd) {
  // The ALIGN_POWER_OF_TWO macro here ensures that column 1 of Atl, Btl,
  // Ctl and Dtl is 32-byte aligned.
  const int buf_elts = ALIGN_POWER_OF_TWO(RESTORATION_PROC_UNIT_PELS, 3);

  int32_t *buf = aom_memalign(
      32, 4 * sizeof(*buf) * ALIGN_POWER_OF_TWO(RESTORATION_PROC_UNIT_PELS, 3));
  if (!buf) return -1;

  const int width_ext = width + 2 * SGRPROJ_BORDER_HORZ;
  const int height_ext = height + 2 * SGRPROJ_BORDER_VERT;

  // Adjusting the stride of A and B here appears to avoid bad cache effects,
  // leading to a significant speed improvement.
  // We also align the stride to a multiple of 32 bytes for efficiency.
  int buf_stride = ALIGN_POWER_OF_TWO(width_ext + 16, 3);

  // The "tl" pointers point at the top-left of the initialised data for the
  // array.
  int32_t *Atl = buf + 0 * buf_elts + 7;
  int32_t *Btl = buf + 1 * buf_elts + 7;
  int32_t *Ctl = buf + 2 * buf_elts + 7;
  int32_t *Dtl = buf + 3 * buf_elts + 7;

  // The "0" pointers are (- SGRPROJ_BORDER_VERT, -SGRPROJ_BORDER_HORZ). Note
  // there's a zero row and column in A, B (integral images), so we move down
  // and right one for them.
  const int buf_diag_border =
      SGRPROJ_BORDER_HORZ + buf_stride * SGRPROJ_BORDER_VERT;

  int32_t *A0 = Atl + 1 + buf_stride;
  int32_t *B0 = Btl + 1 + buf_stride;
  int32_t *C0 = Ctl + 1 + buf_stride;
  int32_t *D0 = Dtl + 1 + buf_stride;

  // Finally, A, B, C, D point at position (0, 0).
  int32_t *A = A0 + buf_diag_border;
  int32_t *B = B0 + buf_diag_border;
  int32_t *C = C0 + buf_diag_border;
  int32_t *D = D0 + buf_diag_border;

  const int dgd_diag_border =
      SGRPROJ_BORDER_HORZ + dgd_stride * SGRPROJ_BORDER_VERT;
  const uint8_t *dgd0 = dgd8 - dgd_diag_border;

  // Generate integral images from the input. C will contain sums of squares; D
  // will contain just sums
  if (highbd)
    integral_images_highbd(CONVERT_TO_SHORTPTR(dgd0), dgd_stride, width_ext,
                           height_ext, Ctl, Dtl, buf_stride);
  else
    integral_images(dgd0, dgd_stride, width_ext, height_ext, Ctl, Dtl,
                    buf_stride);

  const sgr_params_type *const params = &av1_sgr_params[sgr_params_idx];
  // Write to flt0 and flt1
  // If params->r == 0 we skip the corresponding filter. We only allow one of
  // the radii to be 0, as having both equal to 0 would be equivalent to
  // skipping SGR entirely.
  assert(!(params->r[0] == 0 && params->r[1] == 0));
  assert(params->r[0] < AOMMIN(SGRPROJ_BORDER_VERT, SGRPROJ_BORDER_HORZ));
  assert(params->r[1] < AOMMIN(SGRPROJ_BORDER_VERT, SGRPROJ_BORDER_HORZ));

  if (params->r[0] > 0) {
    calc_ab_fast(A, B, C, D, width, height, buf_stride, bit_depth,
                 sgr_params_idx, 0);
    final_filter_fast(flt0, flt_stride, A, B, buf_stride, dgd8, dgd_stride,
                      width, height, highbd);
  }

  if (params->r[1] > 0) {
    calc_ab(A, B, C, D, width, height, buf_stride, bit_depth, sgr_params_idx,
            1);
    final_filter(flt1, flt_stride, A, B, buf_stride, dgd8, dgd_stride, width,
                 height, highbd);
  }
  aom_free(buf);
  return 0;
}